

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directionalscannero1.cpp
# Opt level: O0

int __thiscall
DirectionalScannerO1::first(DirectionalScannerO1 *this,vector<Pt2i,_std::allocator<Pt2i>_> *scan)

{
  bool bVar1;
  vector<Pt2i,_std::allocator<Pt2i>_> *this_00;
  size_type sVar2;
  Pt2i local_30;
  bool *local_28;
  bool *nst;
  int y;
  int x;
  vector<Pt2i,_std::allocator<Pt2i>_> *scan_local;
  DirectionalScannerO1 *this_local;
  
  nst._4_4_ = (this->super_DirectionalScanner).lcx;
  nst._0_4_ = (this->super_DirectionalScanner).lcy;
  local_28 = (this->super_DirectionalScanner).lst2;
  while( true ) {
    if (((this->super_DirectionalScanner).xmax <= nst._4_4_) ||
       (bVar1 = false, (int)nst < (this->super_DirectionalScanner).ymin)) {
      bVar1 = (this->super_DirectionalScanner).dlc2 <=
              (this->super_DirectionalScanner).dla * nst._4_4_ +
              (this->super_DirectionalScanner).dlb * (int)nst;
    }
    _y = (vector<Pt2i,_std::allocator<Pt2i>_> *)scan;
    scan_local = (vector<Pt2i,_std::allocator<Pt2i>_> *)this;
    if (!bVar1) break;
    if ((*local_28 & 1U) != 0) {
      nst._4_4_ = nst._4_4_ + -1;
    }
    nst._0_4_ = (int)nst + 1;
    local_28 = local_28 + 1;
    if ((this->super_DirectionalScanner).fs <= local_28) {
      local_28 = (this->super_DirectionalScanner).steps;
    }
  }
  while( true ) {
    this_00 = _y;
    bVar1 = false;
    if (((this->super_DirectionalScanner).dlc2 <=
         (this->super_DirectionalScanner).dla * nst._4_4_ +
         (this->super_DirectionalScanner).dlb * (int)nst) &&
       (bVar1 = false, (this->super_DirectionalScanner).xmin <= nst._4_4_)) {
      bVar1 = (int)nst < (this->super_DirectionalScanner).ymax;
    }
    if (!bVar1) break;
    Pt2i::Pt2i(&local_30,nst._4_4_,(int)nst);
    std::vector<Pt2i,_std::allocator<Pt2i>_>::push_back
              ((vector<Pt2i,_std::allocator<Pt2i>_> *)this_00,&local_30);
    Pt2i::~Pt2i(&local_30);
    if ((*local_28 & 1U) != 0) {
      nst._4_4_ = nst._4_4_ + -1;
    }
    nst._0_4_ = (int)nst + 1;
    local_28 = local_28 + 1;
    if ((this->super_DirectionalScanner).fs <= local_28) {
      local_28 = (this->super_DirectionalScanner).steps;
    }
  }
  sVar2 = CLI::std::vector<Pt2i,_std::allocator<Pt2i>_>::size(_y);
  return (int)sVar2;
}

Assistant:

int DirectionalScannerO1::first (std::vector<Pt2i> &scan) const
{
  int x = lcx, y = lcy;      // Current position coordinates
  bool *nst = lst2;          // Current step in scan direction (jpts)

  while ((x >= xmax || y < ymin) && dla * x + dlb * y >= dlc2)
  {
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  while (dla * x + dlb * y >= dlc2 && x >= xmin && y < ymax)
  {
    scan.push_back (Pt2i (x, y));
    if (*nst) x--;
    y++;
    if (++nst >= fs) nst = steps;
  }
  return ((int) (scan.size ()));
}